

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

bool basisu::string_split_path(char *p,string *pDrive,string *pDir,string *pFilename,string *pExt)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  string *in_RCX;
  string *in_RDX;
  ulong in_RSI;
  string *in_R8;
  char *pBaseName;
  char *pDirName;
  char nametmp [1024];
  char dirtmp [1024];
  string *in_stack_fffffffffffff778;
  char *in_stack_fffffffffffff788;
  size_t in_stack_fffffffffffff790;
  char *in_stack_fffffffffffff798;
  string *in_stack_fffffffffffff7a8;
  char *in_stack_fffffffffffff7c8;
  char local_438 [1032];
  string *local_30;
  string *local_28;
  string *local_20;
  ulong local_18;
  bool local_1;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  strcpy_safe(in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  strcpy_safe(in_stack_fffffffffffff798,in_stack_fffffffffffff790,in_stack_fffffffffffff788);
  if (local_18 != 0) {
    std::__cxx11::string::resize(local_18);
  }
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dirname(local_438);
  pcVar1 = __xpg_basename(&stack0xfffffffffffff7c8);
  if ((__rhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) ||
     (pcVar1 == (char *)0x0)) {
    local_1 = false;
  }
  else {
    if (local_20 != (string *)0x0) {
      std::__cxx11::string::operator=(local_20,(char *)__rhs);
      lVar2 = std::__cxx11::string::size();
      if ((lVar2 != 0) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 != '/')) {
        std::__cxx11::string::operator+=(local_20,"/");
      }
    }
    if (local_28 != (string *)0x0) {
      std::__cxx11::string::operator=(local_28,pcVar1);
      string_remove_extension(in_stack_fffffffffffff778);
    }
    if (local_30 != (string *)0x0) {
      std::__cxx11::string::operator=(local_30,pcVar1);
      string_get_extension(in_stack_fffffffffffff7a8);
      std::__cxx11::string::operator=(local_30,(string *)&stack0xfffffffffffff798);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff798);
      lVar2 = std::__cxx11::string::size();
      if (lVar2 != 0) {
        std::operator+(in_stack_fffffffffffff7c8,__rhs);
        std::__cxx11::string::operator=(local_30,(string *)&stack0xfffffffffffff778);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff778);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

inline bool string_split_path(const char *p, std::string *pDrive, std::string *pDir, std::string *pFilename, std::string *pExt)
	{
#ifdef _MSC_VER
		char drive_buf[_MAX_DRIVE] = { 0 };
		char dir_buf[_MAX_DIR] = { 0 };
		char fname_buf[_MAX_FNAME] = { 0 };
		char ext_buf[_MAX_EXT] = { 0 };

		errno_t error = _splitpath_s(p, 
			pDrive ? drive_buf : NULL, pDrive ? _MAX_DRIVE : 0,
			pDir ? dir_buf : NULL, pDir ? _MAX_DIR : 0,
			pFilename ? fname_buf : NULL, pFilename ? _MAX_FNAME : 0,
			pExt ? ext_buf : NULL, pExt ? _MAX_EXT : 0);
		if (error != 0)
			return false;

		if (pDrive) *pDrive = drive_buf;
		if (pDir) *pDir = dir_buf;
		if (pFilename) *pFilename = fname_buf;
		if (pExt) *pExt = ext_buf;
		return true;
#else
		char dirtmp[1024], nametmp[1024];
		strcpy_safe(dirtmp, sizeof(dirtmp), p);
		strcpy_safe(nametmp, sizeof(nametmp), p);

		if (pDrive)
			pDrive->resize(0);

		const char *pDirName = dirname(dirtmp);
		const char* pBaseName = basename(nametmp);
		if ((!pDirName) || (!pBaseName))
			return false;

		if (pDir)
		{
			*pDir = pDirName;
			if ((pDir->size()) && (pDir->back() != '/'))
				*pDir += "/";
		}
				
		if (pFilename)
		{
			*pFilename = pBaseName;
			string_remove_extension(*pFilename);
		}

		if (pExt)
		{
			*pExt = pBaseName;
			*pExt = string_get_extension(*pExt);
			if (pExt->size())
				*pExt = "." + *pExt;
		}

		return true;
#endif
	}